

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::operator*
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,
          ChebyshevExpansion *ce2)

{
  Index *__return_storage_ptr___00;
  unsigned_long n;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  unsigned_long n_00;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_01;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_1e8;
  NestedExpressionType local_1d8;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_1c8;
  NestedExpressionType local_1b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
  local_1a8;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>_>
  local_180;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>_>,_0>
  local_158;
  vectype local_128;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_118;
  MatrixXd *V;
  MatrixXd *U;
  Type local_d0;
  ConstantReturnType local_88;
  undefined1 local_70 [8];
  VectorXd b;
  undefined1 local_48 [8];
  VectorXd a;
  size_t Norder_product;
  size_t order2;
  size_t order1;
  ChebyshevExpansion *ce2_local;
  ChebyshevExpansion *this_local;
  
  n = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  this_00 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)coef(ce2);
  n_00 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(this_00);
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = n + (n_00 - 2)
  ;
  __return_storage_ptr___00 =
       &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)__return_storage_ptr___00,
             a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_48,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)__return_storage_ptr___00);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            (&local_88,
             a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_70,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_88);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<unsigned_long>
            (&local_d0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_48,n);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_d0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  other = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)coef(ce2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<unsigned_long>
            ((Type *)&U,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_70,n_00);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&U,other);
  V = UMatrixLibrary::get((UMatrixLibrary *)u_matrix_library,
                          a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows);
  this_01 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
            LMatrixLibrary::get((LMatrixLibrary *)l_matrix_library,
                                a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows);
  local_118 = this_01;
  local_1c8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)V,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_48);
  local_1b8 = (NestedExpressionType)
              Eigen::
              MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>
              ::array((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                       *)&local_1c8);
  local_1e8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)V,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_70);
  local_1d8 = (NestedExpressionType)
              Eigen::
              MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>
              ::array((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                       *)&local_1e8);
  Eigen::
  ArrayBase<Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>>
  ::operator*(&local_1a8,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
               *)&local_1b8,
              (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
               *)&local_1d8);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>_>_>
  ::matrix(&local_180,
           (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>_>
            *)&local_1a8);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_158,this_01,
             (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>_>_>
              *)&local_180);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const>const>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_128,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>_>,_0>_>
              *)&local_158);
  ChebyshevExpansion(__return_storage_ptr__,&local_128,this->m_xmin,this->m_xmax);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_128);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::operator*(const ChebyshevExpansion &ce2) const {

        std::size_t order1 = this->m_c.size()-1,
                    order2 = ce2.coef().size()-1;
        // The order of the product is the sum of the orders of the two expansions
        std::size_t Norder_product = order1 + order2;

        // Create padded vectors, and copy into them the coefficients from this instance
        // and that of the donor
        Eigen::VectorXd a = Eigen::VectorXd::Zero(Norder_product+1),
                        b = Eigen::VectorXd::Zero(Norder_product+1);
        a.head(order1+1) = this->m_c; b.head(order2+1) = ce2.coef();

        // Get the matrices U and V from the libraries
        const Eigen::MatrixXd &U = u_matrix_library.get(Norder_product);
        const Eigen::MatrixXd &V = l_matrix_library.get(Norder_product);

        // Carry out the calculation of the final coefficients
        // U*a is the functional values at the Chebyshev-Lobatto nodes for the first expansion
        // U*b is the functional values at the Chebyshev-Lobatto nodes for the second expansion
        // The functional values are multiplied together in an element-wise sense - this is why both products are turned into arrays
        // The pre-multiplication by V takes us back to coefficients
        return ChebyshevExpansion(V*((U*a).array() * (U*b).array()).matrix(), m_xmin, m_xmax);
    }